

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall adios2::core::IO::SetParameters(IO *this,string *parameters)

{
  int iVar1;
  ScopedTimer __var2268;
  Params parameterMap;
  
  if (SetParameters(std::__cxx11::string_const&)::__var268 == '\0') {
    iVar1 = __cxa_guard_acquire(&SetParameters(std::__cxx11::string_const&)::__var268);
    if (iVar1 != 0) {
      SetParameters::__var268 = (void *)ps_timer_create_("IO::other");
      __cxa_guard_release(&SetParameters(std::__cxx11::string_const&)::__var268);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2268,SetParameters::__var268);
  helper::BuildParametersMap(&parameterMap,parameters,'=',',');
  SetParameters(this,(Params *)&parameterMap._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&parameterMap._M_t);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2268);
  return;
}

Assistant:

void IO::SetParameters(const std::string &parameters)
{
    PERFSTUBS_SCOPED_TIMER("IO::other");
    adios2::Params parameterMap = adios2::helper::BuildParametersMap(parameters, '=', ',');
    SetParameters(parameterMap);
}